

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal
          (ChElementBeamEuler *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ChQuaternion<double> *q;
  ChLoadableU CVar1;
  Scalar SVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer psVar6;
  _func_int **pp_Var7;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar8;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> TVar9;
  int iVar10;
  double *pdVar11;
  Scalar *pSVar12;
  int i_3;
  long lVar13;
  int i;
  long lVar14;
  ulong uVar15;
  element_type *peVar16;
  double dVar17;
  long row;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> sVar27;
  int i_1;
  double delta_p;
  double delta_r;
  ChVectorDynamic<> FiD;
  ChMatrixDynamic<> H_local;
  ChVectorDynamic<> Fi0;
  ChMatrixDynamic<> CK;
  ChVector<double> wa0;
  ChVector<double> wb0;
  vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_> R;
  ChMatrixDynamic<> H_num;
  ChMatrixNM<double,_6,_6> matr_loc;
  ChQuaternion<double> mdeltarotL;
  ChMatrix33<double> AtolocwelA;
  ChMatrixNM<double,_6,_6> KRi_loc;
  ChMatrix33<double> Atoabs;
  long local_550;
  double local_540;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_538;
  Matrix<double,__1,_1,_0,__1,_1> local_530;
  ChVector<double> local_520;
  ChMatrixRef *local_500;
  double local_4f8;
  Matrix<double,__1,_1,_0,__1,_1> local_4f0;
  double local_4d8;
  ChVector<double> local_4d0;
  undefined1 local_4b0 [64];
  undefined1 local_470 [32];
  undefined1 local_450 [24];
  double local_438;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  local_430;
  undefined1 local_400 [288];
  undefined1 local_2e0 [104];
  ChMatrix33<double> local_278;
  _func_int **local_230;
  Matrix<double,__1,_1,_0,__1,_1> *pMStack_228;
  undefined1 local_220 [24];
  Matrix<double,__1,_1,_0,__1,_1> MStack_208;
  variable_if_dynamic<long,__1> vStack_1f8;
  variable_if_dynamic<long,__1> vStack_1f0;
  Matrix<double,__1,_1,_0,__1,_1> local_178 [8];
  ChMatrix33<double> local_f0;
  ChMatrixRef local_a8;
  ChMatrixRef local_80 [2];
  
  local_4f8 = Rfactor;
  local_4d8 = Kfactor;
  local_2e0._88_8_ = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 0xc) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0xc)) {
    if ((this->section).
        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      local_500 = H;
      if ((((Kfactor != 0.0) || (NAN(Kfactor))) || (Rfactor != 0.0)) || (NAN(Rfactor))) {
        if (this->use_numerical_diff_for_KR == true) {
          local_540 = 1e-05;
          local_538.m_matrix = (non_const_type)0x3f50624dd2f1a9fc;
          local_400._0_4_ = 0xc;
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_4f0,(int *)local_400);
          local_400._0_4_ = 0xc;
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_530,(int *)local_400);
          (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[10])(this,&local_4f0);
          local_400._0_4_ = 0xc;
          local_220._0_4_ = 0xc;
          Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                    ((Matrix<double,_1,_1,1,_1,_1> *)&local_430,(int *)local_400,(int *)local_220);
          GetNodeA((ChElementBeamEuler *)local_400);
          pp_Var7 = *(_func_int ***)(local_400._0_8_ + 0x20);
          pMVar8 = *(Matrix<double,__1,_1,_0,__1,_1> **)(local_400._0_8_ + 0x28);
          CVar1 = *(ChLoadableU *)(local_400._0_8_ + 0x30);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          GetNodeA((ChElementBeamEuler *)local_400);
          local_f0.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               *(double *)(local_400._0_8_ + 0x38);
          local_f0.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
               *(double *)(local_400._0_8_ + 0x40);
          local_f0.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               (((ChMatrix33<double> *)(local_400._0_8_ + 0x48))->
               super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          local_f0.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               *(double *)(local_400._0_8_ + 0x50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          GetNodeB((ChElementBeamEuler *)local_400);
          local_230 = *(_func_int ***)(local_400._0_8_ + 0x20);
          pMStack_228 = *(Matrix<double,__1,_1,_0,__1,_1> **)(local_400._0_8_ + 0x28);
          local_2e0._96_8_ = *(ChLoadableU *)(local_400._0_8_ + 0x30);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          GetNodeB((ChElementBeamEuler *)local_400);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               *(double *)(local_400._0_8_ + 0x38);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
               *(double *)(local_400._0_8_ + 0x40);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               (((ChMatrix33<double> *)(local_400._0_8_ + 0x48))->
               super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               *(double *)(local_400._0_8_ + 0x50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
            local_438 = local_540;
            local_2e0._0_8_ = pp_Var7;
            local_2e0._8_8_ = pMVar8;
            local_2e0._16_8_ = CVar1;
            pdVar11 = ChVector<double>::operator[]((ChVector<double> *)local_2e0,(uint)lVar14);
            *pdVar11 = local_438 + *pdVar11;
            GetNodeA((ChElementBeamEuler *)local_400);
            if ((ChVector<double> *)(local_400._0_8_ + 0x20) != (ChVector<double> *)local_2e0) {
              *(undefined8 *)(local_400._0_8_ + 0x20) = local_2e0._0_8_;
              *(undefined8 *)(local_400._0_8_ + 0x28) = local_2e0._8_8_;
              *(undefined8 *)(local_400._0_8_ + 0x30) = local_2e0._16_8_;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])
                      (this,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_4b0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_4b0,&local_540);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,lVar14);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            GetNodeA((ChElementBeamEuler *)local_400);
            *(_func_int ***)(local_400._0_8_ + 0x20) = pp_Var7;
            *(Matrix<double,__1,_1,_0,__1,_1> **)(local_400._0_8_ + 0x28) = pMVar8;
            *(ChLoadableU *)(local_400._0_8_ + 0x30) = CVar1;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          }
          local_550 = 0;
          dVar17 = 1.48219693752374e-323;
          while( true ) {
            TVar9.m_matrix = local_538.m_matrix;
            if (dVar17 == 0.0) break;
            local_4d0.m_data[0] = (double)VNULL;
            local_4d0.m_data[1] = (double)DAT_011dd3e0;
            local_4d0.m_data[2] = (double)DAT_011dd3e8;
            local_438 = (double)((long)dVar17 + -1);
            pdVar11 = ChVector<double>::operator[](&local_4d0,(uint)local_550);
            *pdVar11 = (double)TVar9.m_matrix;
            local_2e0._0_8_ = (_func_int **)0x0;
            local_2e0._8_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
            local_2e0._16_8_ = (ChLoadableU)0x0;
            local_2e0._24_8_ = 0.0;
            ChQuaternion<double>::Q_from_Rotv((ChQuaternion<double> *)local_2e0,&local_4d0);
            ChQuaternion<double>::operator*
                      ((ChQuaternion<double> *)local_4b0,(ChQuaternion<double> *)&local_f0,
                       (ChQuaternion<double> *)local_2e0);
            GetNodeA((ChElementBeamEuler *)local_400);
            ChFrame<double>::SetRot
                      ((ChFrame<double> *)(local_400._0_8_ + 0x18),(ChQuaternion<double> *)local_4b0
                      );
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])(this,&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_470,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_470,(double *)&local_538);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,local_550 + 3);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            GetNodeA((ChElementBeamEuler *)local_400);
            ChFrame<double>::SetRot
                      ((ChFrame<double> *)(local_400._0_8_ + 0x18),(ChQuaternion<double> *)&local_f0
                      );
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            local_550 = local_550 + 1;
            dVar17 = local_438;
          }
          lVar14 = 3;
          local_550 = 0;
          while (dVar17 = local_540, bVar18 = lVar14 != 0, lVar14 = lVar14 + -1, bVar18) {
            local_2e0._0_8_ = local_230;
            local_2e0._8_8_ = pMStack_228;
            local_2e0._16_8_ = local_2e0._96_8_;
            pdVar11 = ChVector<double>::operator[]((ChVector<double> *)local_2e0,(uint)local_550);
            *pdVar11 = dVar17 + *pdVar11;
            GetNodeB((ChElementBeamEuler *)local_400);
            if ((ChVector<double> *)(local_400._0_8_ + 0x20) != (ChVector<double> *)local_2e0) {
              *(undefined8 *)(local_400._0_8_ + 0x20) = local_2e0._0_8_;
              *(undefined8 *)(local_400._0_8_ + 0x28) = local_2e0._8_8_;
              *(undefined8 *)(local_400._0_8_ + 0x30) = local_2e0._16_8_;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])
                      (this,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_4b0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_4b0,&local_540);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,local_550 + 6);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            GetNodeB((ChElementBeamEuler *)local_400);
            *(_func_int ***)(local_400._0_8_ + 0x20) = local_230;
            *(Matrix<double,__1,_1,_0,__1,_1> **)(local_400._0_8_ + 0x28) = pMStack_228;
            *(undefined8 *)(local_400._0_8_ + 0x30) = local_2e0._96_8_;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            local_550 = local_550 + 1;
          }
          lVar14 = 3;
          local_550 = 0;
          while( true ) {
            TVar9.m_matrix = local_538.m_matrix;
            bVar18 = lVar14 == 0;
            lVar14 = lVar14 + -1;
            if (bVar18) break;
            local_4d0.m_data[0] = (double)VNULL;
            local_4d0.m_data[1] = (double)DAT_011dd3e0;
            local_4d0.m_data[2] = (double)DAT_011dd3e8;
            pdVar11 = ChVector<double>::operator[](&local_4d0,(uint)local_550);
            *pdVar11 = (double)TVar9.m_matrix;
            local_2e0._0_8_ = (_func_int **)0x0;
            local_2e0._8_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
            local_2e0._16_8_ = (ChLoadableU)0x0;
            local_2e0._24_8_ = 0.0;
            ChQuaternion<double>::Q_from_Rotv((ChQuaternion<double> *)local_2e0,&local_4d0);
            ChQuaternion<double>::operator*
                      ((ChQuaternion<double> *)local_4b0,(ChQuaternion<double> *)&local_278,
                       (ChQuaternion<double> *)local_2e0);
            GetNodeB((ChElementBeamEuler *)local_400);
            ChFrame<double>::SetRot
                      ((ChFrame<double> *)(local_400._0_8_ + 0x18),(ChQuaternion<double> *)local_4b0
                      );
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])(this,&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_470,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_470,(double *)&local_538);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,local_550 + 9);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            GetNodeB((ChElementBeamEuler *)local_400);
            ChFrame<double>::SetRot
                      ((ChFrame<double> *)(local_400._0_8_ + 0x18),
                       (ChQuaternion<double> *)&local_278);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            local_550 = local_550 + 1;
          }
          local_2e0._0_8_ = &local_430;
          Eigen::
          MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>>
          ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                       *)local_400,
                      (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
                       *)local_2e0,&local_4d8);
          Eigen::
          Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
          ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                   *)local_220,local_500,0,0,0xc,0xc);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                    ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                      *)local_220,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                      *)local_400);
          GetNodeA((ChElementBeamEuler *)local_400);
          local_2e0._0_8_ = *(double *)(local_400._0_8_ + 0xa0);
          local_2e0._8_8_ = *(double *)(local_400._0_8_ + 0xa8);
          local_2e0._16_8_ = *(ChLoadableU *)(local_400._0_8_ + 0xb0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          GetNodeA((ChElementBeamEuler *)local_400);
          ChFrameMoving<double>::GetWvel_loc
                    ((ChVector<double> *)local_4b0,(ChFrameMoving<double> *)(local_400._0_8_ + 0x18)
                    );
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          GetNodeB((ChElementBeamEuler *)local_400);
          local_4d0.m_data[0] = *(double *)(local_400._0_8_ + 0xa0);
          local_4d0.m_data[1] = *(double *)(local_400._0_8_ + 0xa8);
          local_4d0.m_data[2] = *(double *)(local_400._0_8_ + 0xb0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          GetNodeB((ChElementBeamEuler *)local_400);
          ChFrameMoving<double>::GetWvel_loc
                    ((ChVector<double> *)local_470,(ChFrameMoving<double> *)(local_400._0_8_ + 0x18)
                    );
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          for (lVar14 = 0; dVar17 = local_540, lVar14 != 3; lVar14 = lVar14 + 1) {
            local_520.m_data[0] = (double)local_2e0._0_8_;
            local_520.m_data[1] = (double)local_2e0._8_8_;
            local_520.m_data[2] = (double)local_2e0._16_8_;
            pdVar11 = ChVector<double>::operator[](&local_520,(uint)lVar14);
            *pdVar11 = dVar17 + *pdVar11;
            sVar27 = GetNodeA((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x38))
                      ((double *)(local_400._0_8_ + 0x18),&local_520,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])
                      (this,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_450,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_450,&local_540);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,lVar14);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            sVar27 = GetNodeA((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x38))
                      ((double *)(local_400._0_8_ + 0x18),local_2e0,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          }
          lVar14 = 3;
          lVar13 = 0;
          while (TVar9.m_matrix = local_538.m_matrix, bVar18 = lVar14 != 0, lVar14 = lVar14 + -1,
                bVar18) {
            local_520.m_data[0] = (double)local_4b0._0_8_;
            local_520.m_data[1] = (double)local_4b0._8_8_;
            local_520.m_data[2] = (double)local_4b0._16_8_;
            pdVar11 = ChVector<double>::operator[](&local_520,(uint)lVar13);
            *pdVar11 = (double)TVar9.m_matrix + *pdVar11;
            sVar27 = GetNodeA((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x48))
                      ((double *)(local_400._0_8_ + 0x18),&local_520,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])
                      (this,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_450,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_450,(double *)&local_538);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,lVar13 + 3);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            sVar27 = GetNodeA((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x48))
                      ((double *)(local_400._0_8_ + 0x18),local_4b0,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            lVar13 = lVar13 + 1;
          }
          lVar14 = 3;
          lVar13 = 0;
          while (dVar17 = local_540, bVar18 = lVar14 != 0, lVar14 = lVar14 + -1, bVar18) {
            local_520.m_data[0] = local_4d0.m_data[0];
            local_520.m_data[1] = local_4d0.m_data[1];
            local_520.m_data[2] = local_4d0.m_data[2];
            pdVar11 = ChVector<double>::operator[](&local_520,(uint)lVar13);
            *pdVar11 = dVar17 + *pdVar11;
            sVar27 = GetNodeB((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x38))
                      ((double *)(local_400._0_8_ + 0x18),&local_520,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])
                      (this,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_450,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_450,&local_540);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,lVar13 + 6);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            sVar27 = GetNodeB((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x38))
                      ((double *)(local_400._0_8_ + 0x18),&local_4d0,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            lVar13 = lVar13 + 1;
          }
          lVar14 = 3;
          lVar13 = 0;
          while (TVar9.m_matrix = local_538.m_matrix, bVar18 = lVar14 != 0, lVar14 = lVar14 + -1,
                bVar18) {
            local_520.m_data[0] = (double)local_470._0_8_;
            local_520.m_data[1] = (double)local_470._8_8_;
            local_520.m_data[2] = (double)local_470._16_8_;
            pdVar11 = ChVector<double>::operator[](&local_520,(uint)lVar13);
            *pdVar11 = (double)TVar9.m_matrix + *pdVar11;
            sVar27 = GetNodeB((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x48))
                      ((double *)(local_400._0_8_ + 0x18),&local_520,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[10])
                      (this,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                      ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_450,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_530,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4f0);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
            ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                         *)local_450,(double *)&local_538);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_12,_1,_false>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (Matrix<double,__1,__1,_1,__1,__1> *)&local_430,0,lVar13 + 9);
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_12,_1,_false> *)local_220,
                       (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_400);
            sVar27 = GetNodeB((ChElementBeamEuler *)local_400);
            (**(code **)((long)*(double *)(local_400._0_8_ + 0x18) + 0x48))
                      ((double *)(local_400._0_8_ + 0x18),local_470,
                       sVar27.
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
            lVar13 = lVar13 + 1;
          }
          local_520.m_data[0] = (double)&local_430;
          Eigen::
          MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>>
          ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                       *)local_400,
                      (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
                       *)&local_520,&local_4f8);
          Eigen::
          Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
          ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                   *)local_220,local_500,0,0,0xc,0xc);
          Eigen::
          MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
          ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                        *)local_220,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                        *)local_400);
          Eigen::internal::handmade_aligned_free(local_430.m_lhs);
          Eigen::internal::handmade_aligned_free
                    (local_530.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data);
        }
        else {
          local_400._0_4_ = 0xc;
          local_220._0_4_ = 0xc;
          Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                    ((Matrix<double,_1,_1,1,_1,_1> *)&local_4d0,(int *)local_400,(int *)local_220);
          local_400._0_4_ = 0xc;
          local_220._0_4_ = 0xc;
          Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                    ((Matrix<double,_1,_1,1,_1,_1> *)local_470,(int *)local_400,(int *)local_220);
          local_520.m_data[2] = 0.0;
          local_520.m_data[0] = 0.0;
          local_520.m_data[1] = 0.0;
          q = &this->q_element_abs_rot;
          ChMatrix33<double>::Set_A_quaternion(&local_f0,q);
          GetNodeA((ChElementBeamEuler *)local_2e0);
          local_220._0_8_ = *(_func_int **)(local_2e0._0_8_ + 0x38);
          auVar21._0_8_ = (ulong)*(_func_int **)(local_2e0._0_8_ + 0x50) ^ 0x8000000000000000;
          auVar21._8_8_ = 0x8000000000000000;
          local_220._8_8_ = (ulong)*(_func_int **)(local_2e0._0_8_ + 0x40) ^ 0x8000000000000000;
          local_220._16_8_ = (ulong)*(_func_int **)(local_2e0._0_8_ + 0x48) ^ 0x8000000000000000;
          MStack_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)vmovlpd_avx(auVar21);
          ChQuaternion<double>::operator%
                    ((ChQuaternion<double> *)local_400,(ChQuaternion<double> *)local_220,q);
          ChMatrix33<double>::Set_A_quaternion(&local_278,(ChQuaternion<double> *)local_400);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 8));
          GetNodeB((ChElementBeamEuler *)local_4b0);
          local_220._0_8_ = *(Index *)(local_4b0._0_8_ + 0x38);
          auVar22._0_8_ =
               (ulong)(((LhsNested)(local_4b0._0_8_ + 0x50))->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data ^ 0x8000000000000000;
          auVar22._8_8_ = 0x8000000000000000;
          local_220._8_8_ =
               (ulong)(((LhsNested)(local_4b0._0_8_ + 0x40))->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data ^ 0x8000000000000000;
          local_220._16_8_ = (ulong)*(double *)(local_4b0._0_8_ + 0x48) ^ 0x8000000000000000;
          MStack_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)vmovlpd_avx(auVar22);
          ChQuaternion<double>::operator%
                    ((ChQuaternion<double> *)local_400,(ChQuaternion<double> *)local_220,q);
          ChMatrix33<double>::Set_A_quaternion
                    ((ChMatrix33<double> *)local_2e0,(ChQuaternion<double> *)local_400);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4b0 + 8));
          local_450._16_8_ = (pointer)0x0;
          local_450._0_8_ = (LhsNested)0x0;
          local_450._8_8_ = (RhsNested)0x0;
          local_400._0_8_ = &local_f0;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          emplace_back<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)local_450,(ChMatrix33<double> **)local_400);
          local_400._0_8_ = &local_278;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          emplace_back<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)local_450,(ChMatrix33<double> **)local_400);
          local_400._0_8_ = &local_f0;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          emplace_back<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)local_450,(ChMatrix33<double> **)local_400);
          local_400._0_8_ = (ChMatrix33<double> *)local_2e0;
          std::vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>::
          emplace_back<chrono::ChMatrix33<double>*>
                    ((vector<chrono::ChMatrix33<double>*,std::allocator<chrono::ChMatrix33<double>*>>
                      *)local_450,(ChMatrix33<double> **)local_400);
          if (this->use_geometric_stiffness == true) {
            iVar10 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                       _vptr_ChElementBase[3])(this);
            local_400._0_4_ = iVar10;
            Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_4f0,(int *)local_400);
            (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[6])(this,&local_4f0);
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_4b0,
                       &this->Km,0);
            MStack_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows = local_4b0._32_8_;
            vStack_1f8.m_value = local_4b0._40_8_;
            vStack_1f0.m_value = local_4b0._48_8_;
            local_220._0_8_ = local_4b0._0_8_;
            local_220._8_8_ = local_4b0._8_8_;
            local_220._16_8_ = local_4b0._16_8_;
            MStack_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)local_4b0._24_8_;
            Eigen::
            Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
            ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                       *)local_400,(Lhs *)local_220,&local_4f0);
            local_530.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)
                     Eigen::internal::dense_product_base::operator_cast_to_double
                               ((dense_product_base *)local_400);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_4f8;
            auVar23._8_8_ = 0;
            auVar23._0_8_ =
                 ((this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->rdamping_beta;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_4d8;
            auVar21 = vfmadd213sd_fma(auVar23,auVar19,auVar3);
            local_540 = auVar21._0_8_;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                      ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                        *)local_4b0,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Km,
                       &local_540);
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                      (&local_430,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Kg,
                       (double *)&local_530);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const>>
            ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                         *)local_220,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                         *)&local_430,&local_4d8);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const>>
            ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                         *)local_400,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                         *)local_4b0,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                         *)local_220);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>const>>
                      ((Matrix<double,__1,__1,_1,__1,__1> *)&local_520,
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                        *)local_400);
            Eigen::internal::handmade_aligned_free
                      (local_4f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data);
          }
          else {
            auVar20._8_8_ = 0;
            auVar20._0_8_ = local_4f8;
            auVar24._8_8_ = 0;
            auVar24._0_8_ =
                 ((this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->rdamping_beta;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_4d8;
            auVar21 = vfmadd213sd_fma(auVar24,auVar20,auVar4);
            local_220._0_8_ = auVar21._0_8_;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                      ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                        *)local_400,(MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->Km,
                       (double *)local_220);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                      ((Matrix<double,__1,__1,_1,__1,__1> *)&local_520,
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                        *)local_400);
          }
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
          Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     local_400,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_520,
                     (type *)0x0);
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
          Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)local_80,
                     (PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_4d0,
                     (type *)0x0);
          ChMatrixCorotation::ComputeCK
                    ((ChMatrixConstRef)local_400,
                     (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                      *)local_450,4,local_80);
          Eigen::internal::handmade_aligned_free((void *)local_400._40_8_);
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
          Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     local_400,(DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_4d0,
                     (type *)0x0);
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
          Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_a8,
                     (PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_470,
                     (type *)0x0);
          ChMatrixCorotation::ComputeKCt
                    ((ChMatrixConstRef)local_400,
                     (vector<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                      *)local_450,4,&local_a8);
          Eigen::internal::handmade_aligned_free((void *)local_400._40_8_);
          if (this->force_symmetric_stiffness == true) {
            lVar14 = 1;
            lVar13 = 0;
            while (lVar13 < (long)((long)&(((Matrix<double,__1,_1,_0,__1,_1> *)
                                           (local_470._8_8_ + -0x10))->
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          ).m_storage.m_rows + 7)) {
              for (row = lVar14; row < (long)local_470._16_8_; row = row + 1) {
                pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *
                                     )local_470,row,lVar13);
                SVar2 = *pSVar12;
                pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *
                                     )local_470,lVar13,row);
                *pSVar12 = SVar2;
              }
              lVar14 = lVar14 + 1;
              lVar13 = lVar13 + 1;
            }
          }
          Eigen::
          Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
          ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                   *)local_400,local_500,0,0,0xc,0xc);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                      *)local_400,(Matrix<double,__1,__1,_1,__1,__1> *)local_470);
          peVar16 = (this->section).
                    super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          if ((peVar16->compute_inertia_damping_matrix != false) ||
             (peVar16->compute_inertia_stiffness_matrix == true)) {
            Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
                      ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)local_220);
            local_550 = 0;
            lVar14 = 0;
            uVar15 = 0;
            local_540 = (this->super_ChElementBeam).length * 0.5;
            local_530.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)(local_540 * local_4f8);
            local_540 = local_540 * local_4d8;
            while( true ) {
              psVar6 = (this->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4) <=
                  uVar15) break;
              peVar16 = (this->section).
                        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              if (peVar16->compute_inertia_damping_matrix == true) {
                ChFrameMoving<double>::GetWvel_loc
                          ((ChVector<double> *)local_4b0,
                           (ChFrameMoving<double> *)
                           (*(long *)((long)&(psVar6->
                                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr + lVar14) + 0x18));
                (*(peVar16->super_ChBeamSection)._vptr_ChBeamSection[0xe])
                          (peVar16,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_400,
                           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                            *)local_4b0);
                Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                          ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                            *)local_4b0,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_400,
                           (double *)&local_530);
                Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator+=
                          ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_220,
                           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>_>
                            *)local_4b0);
                peVar16 = (this->section).
                          super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
              }
              if (peVar16->compute_inertia_stiffness_matrix == true) {
                ChFrameMoving<double>::GetWvel_loc
                          ((ChVector<double> *)local_4b0,
                           (ChFrameMoving<double> *)
                           (*(long *)((long)&(((this->nodes).
                                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr + lVar14) + 0x18));
                ChFrameMoving<double>::GetWacc_loc
                          ((ChVector<double> *)&local_430,
                           (ChFrameMoving<double> *)
                           (*(long *)((long)&(((this->nodes).
                                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr + lVar14) + 0x18));
                psVar6 = (this->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_538.m_matrix =
                     (non_const_type)
                     (*(long *)((long)&(psVar6->
                                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar14) + 0x58);
                chrono::operator*(&local_538,
                                  (ChVector<double> *)
                                  (*(long *)((long)&(psVar6->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar14) + 0xd8));
                (*(peVar16->super_ChBeamSection)._vptr_ChBeamSection[0xf])
                          (peVar16,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_400,
                           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                            *)local_4b0,&local_430,&local_4f0);
                Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator*
                          ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>
                            *)local_4b0,(MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_400,
                           &local_540);
                Eigen::MatrixBase<Eigen::Matrix<double,6,6,1,6,6>>::operator+=
                          ((MatrixBase<Eigen::Matrix<double,6,6,1,6,6>> *)local_220,
                           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>_>
                            *)local_4b0);
              }
              local_4b0._0_8_ = local_178;
              local_4b0._16_8_ = local_220;
              local_4b0._24_8_ = (XprTypeNested)0x3;
              local_4b0._32_8_ = 3;
              local_4b0._40_8_ = (pointer)0x6;
              lVar13 = local_550 + 3;
              Eigen::
              Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
              ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_3,_false>
                       *)&local_430,local_500,lVar13,lVar13);
              Eigen::
              MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,3,3,false>>
              ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>>
                            *)&local_430,
                           (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>_>
                            *)local_4b0);
              local_4b0._8_8_ = &MStack_208;
              local_4b0._24_8_ = local_220;
              local_4b0._0_8_ =
                   *(long *)((long)&(((this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar14) + 0x58;
              local_4b0._32_8_ = 0;
              local_4b0._40_8_ = (pointer)0x3;
              local_4b0._48_8_ = (pointer)0x6;
              Eigen::
              Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_3,_false>
              ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_3,_false>
                       *)&local_430,local_500,local_550,lVar13);
              Eigen::
              MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,3,3,false>>
              ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,3,false>>
                            *)&local_430,
                           (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>_>
                            *)local_4b0);
              local_550 = local_550 + 6;
              lVar14 = lVar14 + 0x10;
              uVar15 = uVar15 + 1;
            }
          }
          std::
          _Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
          ::~_Vector_base((_Vector_base<chrono::ChMatrix33<double>_*,_std::allocator<chrono::ChMatrix33<double>_*>_>
                           *)local_450);
          Eigen::internal::handmade_aligned_free((void *)local_520.m_data[0]);
          Eigen::internal::handmade_aligned_free((void *)local_470._0_8_);
          local_4f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)local_4d0.m_data[0];
        }
        Eigen::internal::handmade_aligned_free
                  (local_4f0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data);
      }
      else {
        Eigen::
        DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
        ::setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   *)H);
      }
      if ((((double)local_2e0._88_8_ != 0.0) || (NAN((double)local_2e0._88_8_))) ||
         (((local_4f8 != 0.0 || (NAN(local_4f8))) &&
          ((dVar17 = ((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->rdamping_alpha, dVar17 != 0.0 || (NAN(dVar17))))))) {
        local_400._0_4_ = 0xc;
        local_220._0_4_ = 0xc;
        Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                  ((Matrix<double,_1,_1,1,_1,_1> *)local_4b0,(int *)local_400,(int *)local_220);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
                  ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_4b0);
        peVar16 = (this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        (*(peVar16->super_ChBeamSection)._vptr_ChBeamSection[0xd])(peVar16,local_400);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_4f8;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_2e0._88_8_;
        lVar14 = 0;
        uVar15 = 0;
        local_550 = 0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = ((this->section).
                        super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->rdamping_alpha;
        auVar21 = vfmadd231sd_fma(auVar26,auVar25,auVar5);
        local_430.m_lhs = (LhsNested)((this->super_ChElementBeam).length * 0.5 * auVar21._0_8_);
        for (; uVar15 < (ulong)((long)(this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar15 = uVar15 + 1) {
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (double)local_400;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               0.0;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               0.0;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
               2.96439387504748e-323;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>>::operator*
                    ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)local_220,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>> *)
                     &local_278,(double *)&local_430);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_2e0,
                     (Matrix<double,__1,__1,_1,__1,__1> *)local_4b0,lVar14,lVar14);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_2e0,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                      *)local_220);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (double)(local_400 + 0xa8);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
               (double)local_400;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               1.48219693752374e-323;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               1.48219693752374e-323;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
               2.96439387504748e-323;
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>>::operator*
                    ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)local_220,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>> *)
                     &local_278,(double *)&local_430);
          lVar13 = lVar14 + 3;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_2e0,
                     (Matrix<double,__1,__1,_1,__1,__1> *)local_4b0,lVar13,lVar13);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_2e0,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                      *)local_220);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
               (double)(local_400 + 0x18);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
               (double)local_400;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (double)(*(long *)((long)&(((this->nodes).
                                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + local_550) + 0x58);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
               0.0;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
               1.48219693752374e-323;
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
               2.96439387504748e-323;
          Eigen::
          MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>>
          ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                       *)local_220,
                      (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>>
                       *)&local_278,(double *)&local_430);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
                    (&local_f0.super_Matrix<double,_3,_3,_1,_3,_3>,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)local_220);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_220,
                     (Matrix<double,__1,__1,_1,__1,__1> *)local_4b0,lVar14,lVar13);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_220,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_f0);
          local_278.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
               (double)&local_f0;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_3,_3,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_3,_3,_false> *)local_220,
                     (Matrix<double,__1,__1,_1,__1,__1> *)local_4b0,lVar13,lVar14);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,3,3,false>>::operator+=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,3,3,false>> *)
                     local_220,
                     (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)
                     &local_278);
          local_550 = local_550 + 0x10;
          lVar14 = lVar14 + 6;
        }
        Eigen::
        Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
        ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                 *)local_220,local_500,0,0,0xc,0xc);
        Eigen::
        MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
        ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                      *)local_220,(MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_4b0
                    );
        Eigen::internal::handmade_aligned_free((void *)local_4b0._0_8_);
      }
      return;
    }
    __assert_fail("section",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                  ,0x1d3,
                  "virtual void chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  __assert_fail("(H.rows() == 12) && (H.cols() == 12)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamEuler.cpp"
                ,0x1d2,
                "virtual void chrono::fea::ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementBeamEuler::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));
    assert(section);

    //
    // The K stiffness matrix and R damping matrix of this element:
    //

    if (Kfactor || Rfactor) {

        if (use_numerical_diff_for_KR) {

            // numerical evaluation of the K R  matrices
            double delta_p = 1e-5;
            double delta_r = 1e-3;

            ChVectorDynamic<> Fi0(12);
            ChVectorDynamic<> FiD(12);
            this->ComputeInternalForces(Fi0);
            ChMatrixDynamic<> H_num(12, 12);

            // K
            ChVector<>     pa0 = this->GetNodeA()->GetPos();
            ChQuaternion<> qa0 = this->GetNodeA()->GetRot();
            ChVector<>     pb0 = this->GetNodeB()->GetPos();
            ChQuaternion<> qb0 = this->GetNodeB()->GetRot();
            for (int i = 0; i < 3; ++i) {
                ChVector<> paD = pa0; 
                paD[i] += delta_p;
                this->GetNodeA()->SetPos(paD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i) = (FiD - Fi0) / delta_p;
                this->GetNodeA()->SetPos(pa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> rotator(VNULL);  rotator[i] = delta_r;
                ChQuaternion<> mdeltarotL;  mdeltarotL.Q_from_Rotv(rotator); // rot.in local basis - as in system wide vectors
                ChQuaternion<> qaD = qa0 * mdeltarotL;
                this->GetNodeA()->SetRot(qaD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+3) = (FiD - Fi0) / delta_r;
                this->GetNodeA()->SetRot(qa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> pbD = pb0; 
                pbD[i] += delta_p;
                this->GetNodeB()->SetPos(pbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+6) = (FiD - Fi0) / delta_p;
                this->GetNodeB()->SetPos(pb0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> rotator(VNULL);  rotator[i] = delta_r;
                ChQuaternion<> mdeltarotL;  mdeltarotL.Q_from_Rotv(rotator); // rot.in local basis - as in system wide vectors
                ChQuaternion<> qbD = qb0 * mdeltarotL;
                this->GetNodeB()->SetRot(qbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+9) = (FiD - Fi0) / delta_r;
                this->GetNodeB()->SetRot(qb0);
            }
            H.block(0, 0, 12, 12) = - H_num * Kfactor;

            // R
            ChVector<> va0 = this->GetNodeA()->GetPos_dt();
            ChVector<> wa0 = this->GetNodeA()->GetWvel_loc();
            ChVector<> vb0 = this->GetNodeB()->GetPos_dt();
            ChVector<> wb0 = this->GetNodeB()->GetWvel_loc();
            for (int i = 0; i < 3; ++i) {
                ChVector<> vaD = va0; 
                vaD[i] += delta_p;
                this->GetNodeA()->SetPos_dt(vaD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i) = (FiD - Fi0) / delta_p;
                this->GetNodeA()->SetPos_dt(va0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> waD = wa0; 
                waD[i] += delta_r;
                this->GetNodeA()->SetWvel_loc(waD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+3) = (FiD - Fi0) / delta_r;
                this->GetNodeA()->SetWvel_loc(wa0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> vbD = vb0; 
                vbD[i] += delta_p;
                this->GetNodeB()->SetPos_dt(vbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+6) = (FiD - Fi0) / delta_p;
                this->GetNodeB()->SetPos_dt(vb0);
            }
            for (int i = 0; i < 3; ++i) {
                ChVector<> wbD = wb0; 
                wbD[i] += delta_r;
                this->GetNodeB()->SetWvel_loc(wbD);
                this->ComputeInternalForces(FiD);
                H_num.block<12,1>(0, i+9) = (FiD - Fi0) / delta_r;
                this->GetNodeB()->SetWvel_loc(wb0);
            }
            H.block(0, 0, 12, 12) += - H_num * Rfactor;

        }
        else {

            // Corotational K stiffness:
            ChMatrixDynamic<> CK(12, 12);
            ChMatrixDynamic<> CKCt(12, 12);  // the global, corotated, K matrix


            ChMatrixDynamic<> H_local;

            //
            // Corotate local stiffness matrix
            //

            ChMatrix33<> Atoabs(this->q_element_abs_rot);
            ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
            std::vector<ChMatrix33<>*> R;
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelA);
            R.push_back(&Atoabs);
            R.push_back(&AtolocwelB);

            if (this->use_geometric_stiffness) {
                // K = Km+Kg

                // For Kg, compute Px tension of the beam along centerline, using temporary but fast data structures:
                ChVectorDynamic<> displ(this->GetNdofs());
                this->GetStateBlock(displ);
                double Px = -this->Km.row(0) * displ;

                // Rayleigh damping (stiffness proportional part)  [R] = beta*[Km] , so H = kf*[Km+Kg]+rf*[R] = (kf+rf*beta)*[Km] + kf*Kg
                H_local = this->Km * (Kfactor + Rfactor * this->section->GetBeamRaleyghDampingBeta()) + this->Kg * Px * Kfactor;
            }
            else {
                // K = Km

                // Rayleigh damping (stiffness proportional part)  [R] = beta*[Km] , so H = kf*[Km]+rf*[R] = (kf+rf*beta)*[K]
                H_local = this->Km * (Kfactor + Rfactor * this->section->GetBeamRaleyghDampingBeta());
            }

            ChMatrixCorotation::ComputeCK(H_local, R, 4, CK);
            ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

            // For strict symmetry, copy L=U because the computations above might
            // lead to small errors because of numerical roundoff even with force_symmetric_stiffness
            if (force_symmetric_stiffness) {
                for (int row = 0; row < CKCt.rows() - 1; ++row)
                    for (int col = row + 1; col < CKCt.cols(); ++col)
                        CKCt(row, col) = CKCt(col, row);
            }

            //// RADU
            //// Check if the above can be done with the one-liner:
            ////CKCt.triangularView<Eigen::Upper>() = CKCt.transpose();

            H.block(0, 0, 12, 12) = CKCt;

            // Add inertial stiffness matrix and inertial damping matrix (gyroscopic damping), 
            // if enabled in section material.
            // These matrices are not symmetric. Also note
            if (this->section->compute_inertia_damping_matrix || this->section->compute_inertia_stiffness_matrix) {
                ChMatrixNM<double, 6, 6> matr_loc;
                ChMatrixNM<double, 6, 6> KRi_loc;
                KRi_loc.setZero();
                // A lumped version of the inertial damping/stiffness matrix computation is used here, on a per-node basis:
                double node_multiplier_fact_R = 0.5 * length * Rfactor;
                double node_multiplier_fact_K = 0.5 * length * Kfactor;
                for (int i = 0; i < nodes.size(); ++i) {
                    int stride = i * 6;
                    if (this->section->compute_inertia_damping_matrix) {
                        this->section->ComputeInertiaDampingMatrix(matr_loc, nodes[i]->GetWvel_loc());
                        KRi_loc += matr_loc * node_multiplier_fact_R;
                    }
                    if (this->section->compute_inertia_stiffness_matrix) {
                        this->section->ComputeInertiaStiffnessMatrix(matr_loc, nodes[i]->GetWvel_loc(), nodes[i]->GetWacc_loc(), (nodes[i]->GetA().transpose()) * nodes[i]->GetPos_dtdt()); // assume x_dtdt in local frame!
                        KRi_loc += matr_loc * node_multiplier_fact_K;
                    }
                    // corotate the local damping and stiffness matrices (at once, already scaled) into absolute one
                    //H.block<3, 3>(stride,   stride  ) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0,0) * (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(0,0) is null by construction
                    H.block<3, 3>(stride + 3, stride + 3) += KRi_loc.block<3, 3>(3, 3);
                    H.block<3, 3>(stride, stride + 3) += nodes[i]->GetA() * KRi_loc.block<3, 3>(0, 3);
                    // H.block<3, 3>(stride+3, stride)   +=                    KRi_loc.block<3, 3>(3,0) * (nodes[i]->GetA().transpose()); // NOTE: not needed as KRi_loc.block<3, 3>(3,0) is null by construction
                }
            }
        }

    } 
    else
		H.setZero();

    //
    // The M mass matrix of this element:  
    //

    if (Mfactor || (Rfactor && this->section->GetBeamRaleyghDampingAlpha()) ) {

        ChMatrixDynamic<> Mloc(12, 12);
        Mloc.setZero();
        ChMatrix33<> Mxw;

        //
        // "lumped" M mass matrix
        //
        ChMatrixNM<double, 6, 6> sectional_mass;
        this->section->ComputeInertiaMatrix(sectional_mass);

        // Rayleigh damping (stiffness proportional part)  [Rm] = alpha*[M] , so H += km*[M]+rf*[Rm]  H += (km+rf*alpha)*[M]

        double node_multiplier_fact = 0.5 * length * (Mfactor + Rfactor * this->section->GetBeamRaleyghDampingAlpha());
        for (int i = 0; i < nodes.size(); ++i) {
            int stride = i * 6;
            // if there is no mass center offset, the upper right and lower left blocks need not be rotated,
            // hence it can be the simple (constant) expression
            //   Mloc.block<6, 6>(stride, stride) += sectional_mass * node_multiplier_fact;
            // but the more general case needs the rotations, hence:
            Mloc.block<3, 3>(stride,   stride  ) += sectional_mass.block<3, 3>(0,0) * node_multiplier_fact;
            Mloc.block<3, 3>(stride+3, stride+3) += sectional_mass.block<3, 3>(3,3) * node_multiplier_fact;
            Mxw = nodes[i]->GetA() * sectional_mass.block<3, 3>(0,3) * node_multiplier_fact;
            Mloc.block<3, 3>(stride,   stride+3) += Mxw;
            Mloc.block<3, 3>(stride+3, stride)   += Mxw.transpose();
        }
        
        /* The following would be needed if consistent mass matrix is used, but...
        ChMatrix33<> Atoabs(this->q_element_abs_rot);
        ChMatrix33<> AtolocwelA(this->GetNodeA()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        ChMatrix33<> AtolocwelB(this->GetNodeB()->Frame().GetRot().GetConjugate() % this->q_element_abs_rot);
        std::vector< ChMatrix33<>* > R;
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelA);
        R.push_back(&Atoabs);
        R.push_back(&AtolocwelB);

        ChMatrixCorotation::ComputeCK(Mloc, R, 4, CK);
        ChMatrixCorotation::ComputeKCt(CK, R, 4, CKCt);

        H.block(0,0,12,12) += CKCt;
        */

        // ..rather do this because lumped mass matrix does not need rotation transf.
        H.block(0, 0, 12, 12) += Mloc;

        //// TODO better per-node lumping, or 4x4 consistent mass matrices, maybe with integration if not uniform
        // materials.
    }

}